

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListShiftJoinType(Parse *pParse,SrcList *p)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  byte local_1d;
  int local_1c;
  u8 allFlags;
  int i;
  SrcList *p_local;
  Parse *pParse_local;
  
  if ((p != (SrcList *)0x0) && (1 < p->nSrc)) {
    local_1c = p->nSrc + -1;
    local_1d = 0;
    do {
      bVar1 = p->a[local_1c + -1].fg.jointype;
      p->a[local_1c].fg.jointype = bVar1;
      local_1d = local_1d | bVar1;
      local_1c = local_1c + -1;
    } while (0 < local_1c);
    p->a[0].fg.jointype = '\0';
    if ((local_1d & 0x10) != 0) {
      local_1c = p->nSrc;
      do {
        iVar2 = local_1c;
        local_1c = iVar2 + -1;
        bVar3 = false;
        if (0 < local_1c) {
          bVar3 = (p->a[local_1c].fg.jointype & 0x10) == 0;
        }
      } while (bVar3);
      local_1c = iVar2 + -2;
      do {
        p->a[local_1c].fg.jointype = p->a[local_1c].fg.jointype | 0x40;
        local_1c = local_1c + -1;
      } while (-1 < local_1c);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListShiftJoinType(Parse *pParse, SrcList *p){
  (void)pParse;
  if( p && p->nSrc>1 ){
    int i = p->nSrc-1;
    u8 allFlags = 0;
    do{
      allFlags |= p->a[i].fg.jointype = p->a[i-1].fg.jointype;
    }while( (--i)>0 );
    p->a[0].fg.jointype = 0;

    /* All terms to the left of a RIGHT JOIN should be tagged with the
    ** JT_LTORJ flags */
    if( allFlags & JT_RIGHT ){
      for(i=p->nSrc-1; ALWAYS(i>0) && (p->a[i].fg.jointype&JT_RIGHT)==0; i--){}
      i--;
      assert( i>=0 );
      do{
        p->a[i].fg.jointype |= JT_LTORJ;
      }while( (--i)>=0 );
    }
  }
}